

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

BLOCK_SIZE av1_predict_max_partition(AV1_COMP *cpi,MACROBLOCK *x,float *features)

{
  double dVar1;
  MAX_PART_PRED_MODE MVar2;
  char cVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  float fVar7;
  float probs [4];
  float scores [4];
  ulong uVar6;
  
  scores[0] = 0.0;
  scores[1] = 0.0;
  scores[2] = 0.0;
  scores[3] = 0.0;
  (*av1_nn_predict)(features,&av1_max_part_pred_nn_config,1,scores);
  if ((cpi->sf).part_sf.auto_max_partition_based_on_simple_motion == '\x01') {
    uVar6 = 0;
    for (uVar5 = 1; cVar3 = (char)uVar6, uVar5 != 4; uVar5 = uVar5 + 1) {
      if (scores[0] < scores[uVar5]) {
        uVar6 = uVar5 & 0xffffffff;
        scores[0] = scores[uVar5];
      }
    }
  }
  else {
    probs[0] = 0.0;
    probs[1] = 0.0;
    probs[2] = 0.0;
    probs[3] = 0.0;
    av1_nn_softmax(scores,probs,4);
    MVar2 = (cpi->sf).part_sf.auto_max_partition_based_on_simple_motion;
    cVar3 = '\x03';
    if (MVar2 == '\x03') {
      uVar4 = av1_get_perpixel_variance_facade
                        (cpi,&x->e_mbd,&x->plane[0].src,((cpi->common).seq_params)->sb_size,0);
      if (uVar4 < 0x11) goto LAB_001cfec6;
      dVar1 = *(double *)(&DAT_00457a60 + (ulong)(uVar4 < 0x80) * 8);
      cVar3 = -1;
      uVar5 = 4;
      do {
        uVar6 = uVar5;
        uVar5 = uVar6 - 1;
        if ((int)(uint)uVar5 < 0) goto LAB_001cfec6;
        if ((uint)uVar5 < 3) {
          fVar7 = probs[uVar6] + probs[uVar5 & 0xffffffff];
          probs[uVar5 & 0xffffffff] = fVar7;
        }
        else {
          fVar7 = probs[uVar5 & 0xffffffff];
        }
      } while ((double)fVar7 <= dVar1);
    }
    else {
      if (MVar2 != '\x02') goto LAB_001cfec6;
      cVar3 = -1;
      uVar5 = 4;
      do {
        uVar6 = uVar5;
        uVar5 = uVar6 - 1;
        if ((int)(uint)uVar5 < 0) goto LAB_001cfec6;
        if ((uint)uVar5 < 3) {
          fVar7 = probs[uVar6] + probs[uVar5 & 0xffffffff];
          probs[uVar5 & 0xffffffff] = fVar7;
        }
        else {
          fVar7 = probs[uVar5 & 0xffffffff];
        }
      } while (fVar7 <= 0.2);
    }
    cVar3 = (char)uVar6 + -1;
  }
LAB_001cfec6:
  return cVar3 * '\x03' + BLOCK_16X16;
}

Assistant:

BLOCK_SIZE av1_predict_max_partition(const AV1_COMP *const cpi,
                                     const MACROBLOCK *const x,
                                     const float *features) {
  float scores[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  const NN_CONFIG *nn_config = &av1_max_part_pred_nn_config;

  assert(cpi->sf.part_sf.auto_max_partition_based_on_simple_motion !=
         NOT_IN_USE);

  av1_nn_predict(features, nn_config, 1, scores);

  int result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1;
  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      DIRECT_PRED) {
    result = 0;
    float max_score = scores[0];
    for (int i = 1; i < MAX_NUM_CLASSES_MAX_MIN_PART_PRED; ++i) {
      if (scores[i] > max_score) {
        max_score = scores[i];
        result = i;
      }
    }
    return get_block_size(result);
  }

  float probs[MAX_NUM_CLASSES_MAX_MIN_PART_PRED] = { 0.0f };
  av1_nn_softmax(scores, probs, MAX_NUM_CLASSES_MAX_MIN_PART_PRED);

  if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
      RELAXED_PRED) {
    for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
         --result) {
      if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
        probs[result] += probs[result + 1];
      }
      if (probs[result] > 0.2) break;
    }
  } else if (cpi->sf.part_sf.auto_max_partition_based_on_simple_motion ==
             ADAPT_PRED) {
    const BLOCK_SIZE sb_size = cpi->common.seq_params->sb_size;
    // TODO(debargha): x->source_variance is unavailable at this point,
    // so compute. The redundant recomputation later can be removed.
    const unsigned int source_variance = av1_get_perpixel_variance_facade(
        cpi, &x->e_mbd, &x->plane[0].src, sb_size, AOM_PLANE_Y);
    if (source_variance > 16) {
      const double thresh = source_variance < 128 ? 0.05 : 0.1;
      for (result = MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1; result >= 0;
           --result) {
        if (result < MAX_NUM_CLASSES_MAX_MIN_PART_PRED - 1) {
          probs[result] += probs[result + 1];
        }
        if (probs[result] > thresh) break;
      }
    }
  }

  return get_block_size(result);
}